

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

xmlNodePtr xmlNewEntityRef(xmlDocPtr doc,xmlChar *name)

{
  xmlRegisterNodeFunc *pp_Var1;
  xmlNodePtr cur;
  xmlChar *name_local;
  xmlDocPtr doc_local;
  
  doc_local = (xmlDocPtr)(*xmlMalloc)(0x78);
  if (doc_local == (xmlDocPtr)0x0) {
    (*xmlFree)(name);
    doc_local = (xmlDocPtr)0x0;
  }
  else {
    memset(doc_local,0,0x78);
    doc_local->type = XML_ENTITY_REF_NODE;
    doc_local->doc = doc;
    doc_local->name = (char *)name;
    if ((xmlRegisterCallbacks != 0) &&
       (pp_Var1 = __xmlRegisterNodeDefaultValue(), *pp_Var1 != (xmlRegisterNodeFunc)0x0)) {
      pp_Var1 = __xmlRegisterNodeDefaultValue();
      (**pp_Var1)((xmlNodePtr)doc_local);
    }
  }
  return (xmlNodePtr)doc_local;
}

Assistant:

static xmlNodePtr
xmlNewEntityRef(xmlDocPtr doc, xmlChar *name) {
    xmlNodePtr cur;

    /*
     * Allocate a new node and fill the fields.
     */
    cur = (xmlNodePtr) xmlMalloc(sizeof(xmlNode));
    if (cur == NULL) {
        xmlFree(name);
	return(NULL);
    }
    memset(cur, 0, sizeof(xmlNode));
    cur->type = XML_ENTITY_REF_NODE;
    cur->doc = doc;
    cur->name = name;

    if ((xmlRegisterCallbacks) && (xmlRegisterNodeDefaultValue))
	xmlRegisterNodeDefaultValue(cur);

    return(cur);
}